

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O1

char * uenum_next_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  UEnumNext *UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  int32_t dummyLength;
  undefined8 uStack_8;
  
  if ((en != (UEnumeration *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    UNRECOVERED_JUMPTABLE = en->next;
    if (UNRECOVERED_JUMPTABLE != (UEnumNext *)0x0) {
      if (resultLength != (int32_t *)0x0) {
        pcVar1 = (*UNRECOVERED_JUMPTABLE)(en,resultLength,status);
        return pcVar1;
      }
      uStack_8 = (ulong)UNRECOVERED_JUMPTABLE & 0xffffffff;
      pcVar1 = (*UNRECOVERED_JUMPTABLE)(en,(int32_t *)((long)&uStack_8 + 4),status);
      return pcVar1;
    }
    *status = U_UNSUPPORTED_ERROR;
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char* U_EXPORT2
uenum_next(UEnumeration* en,
          int32_t* resultLength,
          UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return NULL;
    }
    if (en->next != NULL) {
        if (resultLength != NULL) {
            return en->next(en, resultLength, status);
        }
        else {
            int32_t dummyLength=0;
            return en->next(en, &dummyLength, status);
        }
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return NULL;
    }
}